

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

CoatedDiffuseMaterial *
pbrt::CoatedDiffuseMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CoatedDiffuseMaterial *pCVar6;
  uintptr_t iptr_2;
  ushort uVar7;
  uintptr_t iptr;
  FloatTextureHandle thickness;
  SpectrumTextureHandle albedo;
  FloatTextureHandle vRoughness;
  FloatTextureHandle uRoughness;
  SpectrumTextureHandle reflectance;
  FloatTextureHandle displacement;
  FloatTextureHandle g;
  FloatTextureHandle eta;
  string local_b8;
  uint8_t local_91;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  TextureParameterDictionary local_70;
  Image *local_60;
  undefined1 local_58 [16];
  TextureParameterDictionary local_48;
  undefined8 local_38;
  undefined4 extraout_var_03;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  local_60 = normalMap;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"reflectance","");
  local_38 = 0;
  TextureParameterDictionary::GetSpectrumTexture
            (&local_70,(string *)parameters,(SpectrumHandle *)&local_b8,(SpectrumType)&local_38,
             (Allocator)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (((ulong)local_70.dict & 0xffffffffffff) == 0) {
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar3) = 0x3f000000;
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
    *(ulong *)CONCAT44(extraout_var_00,iVar4) = CONCAT44(extraout_var,iVar3) | 0x1000000000000;
    local_70.dict = (ParameterDictionary *)(CONCAT44(extraout_var_00,iVar4) | 0x5000000000000);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"uroughness","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_80 + 8),(string *)parameters,
             (memory_resource *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vroughness","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)local_80,(string *)parameters,
             (memory_resource *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((local_80._8_8_ & 0xffffffffffff) == 0) {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"roughness","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)local_90,(string *)parameters,0.0,
               (memory_resource *)&local_b8);
    local_80._8_8_ = local_90._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_80._0_8_ & 0xffffffffffff) == 0) {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"roughness","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)local_90,(string *)parameters,0.0,
               (memory_resource *)&local_b8);
    local_80._0_8_ = local_90._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"thickness","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_90,(string *)parameters,0.01,
             (memory_resource *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"eta","");
  TextureParameterDictionary::GetFloatTexture
            (&local_48,(string *)parameters,1.5,(memory_resource *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"maxdepth","");
  local_70.textures._4_4_ = TextureParameterDictionary::GetOneInt(parameters,&local_b8,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"nsamples","");
  iVar3 = TextureParameterDictionary::GetOneInt(parameters,&local_b8,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"twosided","");
  local_91 = TextureParameterDictionary::GetOneBool(parameters,&local_b8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"g","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_58 + 8),(string *)parameters,0.0,
             (memory_resource *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"albedo","");
  local_48.textures = (NamedTextures *)0x0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_90 + 8),(string *)parameters,
             (SpectrumHandle *)&local_b8,(int)&local_48 + 8,(Allocator)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((local_90._8_8_ & 0xffffffffffff) == 0) {
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var_01,iVar4) = 0;
    iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
    *(ulong *)CONCAT44(extraout_var_02,iVar5) = CONCAT44(extraout_var_01,iVar4) | 0x1000000000000;
    local_90._8_8_ = CONCAT44(extraout_var_02,iVar5) | 0x5000000000000;
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"displacement","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)local_58,(string *)parameters,
             (memory_resource *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"remaproughness","");
  bVar2 = TextureParameterDictionary::GetOneBool(parameters,&local_b8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x50,8);
  pCVar6 = (CoatedDiffuseMaterial *)CONCAT44(extraout_var_03,iVar4);
  uVar7 = (ushort)local_70.textures._4_1_ | (ushort)(iVar3 << 8);
  (pCVar6->displacement).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_58._0_8_;
  pCVar6->normalMap = local_60;
  (pCVar6->reflectance).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)local_70.dict;
  (pCVar6->albedo).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_90._8_8_;
  (pCVar6->uRoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_80._8_8_;
  (pCVar6->vRoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_80._0_8_;
  (pCVar6->thickness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_90._0_8_;
  (pCVar6->g).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_58._8_8_;
  (pCVar6->eta).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_48.dict;
  pCVar6->remapRoughness = bVar2;
  (pCVar6->config).twoSided = local_91;
  (pCVar6->config).maxDepth = (char)uVar7;
  (pCVar6->config).nSamples = (char)(uVar7 >> 8);
  return pCVar6;
}

Assistant:

CoatedDiffuseMaterial *CoatedDiffuseMaterial::Create(
    const TextureParameterDictionary &parameters, Image *normalMap, const FileLoc *loc,
    Allocator alloc) {
    SpectrumTextureHandle reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Albedo, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.5f));

    FloatTextureHandle uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTextureHandle vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTextureHandle thickness = parameters.GetFloatTexture("thickness", .01, alloc);
    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.5, alloc);

    LayeredBxDFConfig config;
    config.maxDepth = parameters.GetOneInt("maxdepth", config.maxDepth);
    config.nSamples = parameters.GetOneInt("nsamples", config.nSamples);
    config.twoSided = parameters.GetOneBool("twosided", config.twoSided);

    FloatTextureHandle g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTextureHandle albedo =
        parameters.GetSpectrumTexture("albedo", nullptr, SpectrumType::Albedo, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    return alloc.new_object<CoatedDiffuseMaterial>(
        reflectance, uRoughness, vRoughness, thickness, albedo, g, eta, displacement,
        normalMap, remapRoughness, config);
}